

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

int __thiscall
helics::NetworkCommsInterface::PortAllocator::findOpenPort
          (PortAllocator *this,int count,string_view host)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view host_00;
  string_view host_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view host_02;
  string_view host_03;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  mapped_type_conflict *pmVar5;
  key_type *in_RCX;
  PortAllocator *in_RDX;
  int in_ESI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view sVar6;
  int ii;
  int nextPort;
  iterator np;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  PortAllocator *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar7;
  PortAllocator *in_stack_ffffffffffffff30;
  key_type *in_stack_ffffffffffffff38;
  key_type *__k;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffff40;
  PortAllocator *this_00;
  key_type *pkVar8;
  PortAllocator *in_stack_ffffffffffffff50;
  key_type *in_stack_ffffffffffffff58;
  PortAllocator *in_stack_ffffffffffffff60;
  key_type *local_98;
  _Self local_90;
  int local_84;
  _Self local_80 [10];
  undefined4 in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar9;
  key_type *local_10;
  
  pkVar8 = in_RCX;
  pbVar9 = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  iVar3 = (int)((ulong)pkVar8 >> 0x20);
  __x._M_len._4_4_ = in_stack_ffffffffffffff2c;
  __x._M_len._0_4_ = in_stack_ffffffffffffff28;
  __x._M_str = (char *)in_stack_ffffffffffffff30;
  __y._M_str = in_stack_ffffffffffffff20;
  __y._M_len = (size_t)in_stack_ffffffffffffff18;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    __x_00._M_len._4_4_ = in_stack_ffffffffffffff2c;
    __x_00._M_len._0_4_ = in_stack_ffffffffffffff28;
    __x_00._M_str = (char *)in_stack_ffffffffffffff30;
    __y_00._M_str = in_stack_ffffffffffffff20;
    __y_00._M_len = (size_t)in_stack_ffffffffffffff18;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      local_80[0]._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                  (key_type *)0x451aee);
      local_84 = (int)in_RDI->_M_len;
      local_90._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar2 = std::operator==(local_80,&local_90);
      if (bVar2) {
        sVar6._M_str = (char *)in_stack_ffffffffffffff40;
        sVar6._M_len = (size_t)in_stack_ffffffffffffff38;
        sVar6 = addNewHost(in_stack_ffffffffffffff30,sVar6);
        in_stack_ffffffffffffff60 = (PortAllocator *)sVar6._M_len;
        local_98 = (key_type *)sVar6._M_str;
        local_10 = local_98;
        sVar1 = in_RDI->_M_len;
        this_00 = in_stack_ffffffffffffff60;
        pmVar5 = std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        *pmVar5 = (mapped_type_conflict)sVar1;
        iVar3 = in_ESI;
        pmVar5 = std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        *pmVar5 = in_ESI + *pmVar5;
        in_stack_ffffffffffffff58 = in_RCX;
      }
      else {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                               *)0x451bd9);
        local_84 = ppVar4->second;
        iVar3 = in_ESI;
        this_00 = in_RDX;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                               *)0x451bfb);
        ppVar4->second = in_ESI + ppVar4->second;
        in_RDX = in_stack_ffffffffffffff50;
        local_10 = in_RCX;
      }
      host_00._M_str._0_4_ = in_stack_ffffffffffffff28;
      host_00._M_len = (size_t)in_stack_ffffffffffffff20;
      host_00._M_str._4_4_ = in_stack_ffffffffffffff2c;
      pkVar8 = local_10;
      bVar2 = isPortUsed(in_stack_ffffffffffffff18,host_00,(int)((ulong)in_RDI >> 0x20));
      if (bVar2) {
        do {
          local_84 = local_84 + 1;
          host_01._M_str._0_4_ = in_stack_ffffffffffffff28;
          host_01._M_len = (size_t)in_stack_ffffffffffffff20;
          host_01._M_str._4_4_ = in_stack_ffffffffffffff2c;
          __k = local_10;
          bVar2 = isPortUsed(in_stack_ffffffffffffff18,host_01,(int)((ulong)in_RDI >> 0x20));
        } while (bVar2);
        iVar7 = local_84 + iVar3;
        pmVar5 = std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                               *)this_00,__k);
        *pmVar5 = iVar7;
      }
      for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        host_02._M_str = (char *)in_stack_ffffffffffffff60;
        host_02._M_len = (size_t)in_stack_ffffffffffffff58;
        addUsedPort(in_RDX,host_02,(int)((ulong)pkVar8 >> 0x20));
      }
      return local_84;
    }
  }
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffff08));
  host_03._M_str = (char *)in_RDX;
  host_03._M_len = (size_t)pbVar9;
  iVar3 = findOpenPort((PortAllocator *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),iVar3,host_03);
  return iVar3;
}

Assistant:

int NetworkCommsInterface::PortAllocator::findOpenPort(int count, std::string_view host)
{
    if ((host == "127.0.0.1") || (host == "::1")) {
        return findOpenPort(count, localHostString);
    }
    auto np = nextPorts.find(host);
    int nextPort = startingPort;
    if (np == nextPorts.end()) {
        host = addNewHost(host);
        nextPorts[host] = startingPort;
        nextPorts[host] += count;
    } else {
        nextPort = np->second;
        (np->second) += count;
    }
    if (isPortUsed(host, nextPort)) {
        ++nextPort;
        while (isPortUsed(host, nextPort)) {
            ++nextPort;
        }
        nextPorts[host] = nextPort + count;
    }
    for (int ii = 0; ii < count; ++ii) {
        addUsedPort(host, nextPort + ii);
    }
    return nextPort;
}